

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

ll128 * Constant::Util::power(ll128 a,ll128 b)

{
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined1 auVar1 [16];
  ll128 ret;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 uVar2;
  ll128 *local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  ll128 *local_18;
  
  local_60 = 0;
  local_68 = (ll128 *)0x1;
  uVar2 = 0;
  auVar1 = __modti3(in_RDI,in_RSI);
  __modti3(auVar1._0_8_ + 0x16345785d8a0003,
           auVar1._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar1._0_8_),0x16345785d8a0003,uVar2);
  auVar1 = __modti3(in_RDX,in_RCX,0x16345785d8a0003,uVar2);
  auVar1 = __modti3(auVar1._0_8_ + 0x16345785d8a0003,
                    auVar1._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar1._0_8_),0x16345785d8a0003,
                    uVar2);
  if (auVar1._0_8_ == 0 && auVar1._8_8_ == 0) {
    local_18 = (ll128 *)0x1;
  }
  else {
    while( true ) {
      local_50 = auVar1._8_8_;
      local_58 = auVar1._0_8_;
      if (local_50 < (long)(ulong)(local_58 == 0)) break;
      if ((auVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_stack_ffffffffffffff40 = local_60;
      }
      a_00._8_8_ = uVar2;
      a_00._0_8_ = in_stack_ffffffffffffff40;
      local_68 = get_residual((ll128)a_00);
      a_01._8_8_ = uVar2;
      a_01._0_8_ = in_stack_ffffffffffffff40;
      get_residual((ll128)a_01);
      auVar1 = auVar1 >> 1;
      local_60 = extraout_RDX;
    }
    local_18 = local_68;
  }
  return local_18;
}

Assistant:

ll128 Constant::Util::power(ll128 a, ll128 b) {
    ll128 ret = 1;
    a = (a%MOD+MOD)%MOD;
    b = (b%MOD+MOD)%MOD;
    if (b == 0)
        return 1;
    while (b > 0) {
        if (b&1) ret = ret * a;
        ret = get_residual(ret);
        a = a * a;
        a = get_residual(a);
        b >>= 1;
    }
    return ret;
}